

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

bool __thiscall nv::Image::load(Image *this,char *name)

{
  uint uVar1;
  Format FVar2;
  Color32 *pCVar3;
  bool bVar4;
  AutoPtr<nv::Image> img;
  AutoPtr<nv::Image> local_18;
  
  mem::free(this->m_data);
  this->m_data = (Color32 *)0x0;
  local_18.m_ptr = ImageIO::load(name);
  if (local_18.m_ptr != (Image *)0x0) {
    uVar1 = this->m_width;
    this->m_width = (local_18.m_ptr)->m_width;
    (local_18.m_ptr)->m_width = uVar1;
    uVar1 = this->m_height;
    this->m_height = (local_18.m_ptr)->m_height;
    (local_18.m_ptr)->m_height = uVar1;
    FVar2 = this->m_format;
    this->m_format = (local_18.m_ptr)->m_format;
    (local_18.m_ptr)->m_format = FVar2;
    pCVar3 = this->m_data;
    this->m_data = (local_18.m_ptr)->m_data;
    (local_18.m_ptr)->m_data = pCVar3;
  }
  bVar4 = local_18.m_ptr != (Image *)0x0;
  AutoPtr<nv::Image>::~AutoPtr(&local_18);
  return bVar4;
}

Assistant:

bool Image::load(const char * name)
{
	free();
	
	AutoPtr<Image> img(ImageIO::load(name));
	if (img == NULL) {
		return false;
	}
	
	swap(m_width, img->m_width);
	swap(m_height, img->m_height);
	swap(m_format, img->m_format);
	swap(m_data, img->m_data);
	
	return true;
}